

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

TileLayerParams * __thiscall
CoreML::Specification::TileLayerParams::New(TileLayerParams *this,Arena *arena)

{
  TileLayerParams *this_00;
  
  this_00 = (TileLayerParams *)operator_new(0x28);
  TileLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::TileLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

TileLayerParams* TileLayerParams::New(::google::protobuf::Arena* arena) const {
  TileLayerParams* n = new TileLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}